

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnsetCommand.cxx
# Opt level: O1

bool __thiscall
cmUnsetCommand::InitialPass
          (cmUnsetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  char *__s1;
  cmMakefile *pcVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *__dest;
  long lVar6;
  ulong uVar7;
  allocator local_49;
  string local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  uVar7 = lVar6 >> 5;
  if (lVar6 == 0 || 2 < uVar7) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_48);
LAB_0028f279:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  else {
    __s1 = (pbVar1->_M_dataplus)._M_p;
    iVar4 = strncmp(__s1,"ENV{",4);
    if (iVar4 == 0) {
      sVar5 = strlen(__s1);
      if (sVar5 < 6) goto LAB_0028f1dc;
      __dest = (char *)operator_new__(sVar5);
      sVar5 = strlen(__s1);
      strncpy(__dest,__s1 + 4,sVar5 - 5);
      sVar5 = strlen(__s1);
      __dest[sVar5 - 5] = '\0';
      cmSystemTools::UnsetEnv(__dest);
      operator_delete__(__dest);
    }
    else {
LAB_0028f1dc:
      if (uVar7 == 2) {
        iVar4 = std::__cxx11::string::compare((char *)(pbVar1 + 1));
        if (iVar4 != 0) goto LAB_0028f227;
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&local_48,__s1,&local_49);
        cmMakefile::RemoveCacheDefinition(pcVar2,&local_48);
      }
      else {
        if (uVar7 != 1) {
LAB_0028f227:
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x40) {
            iVar4 = std::__cxx11::string::compare((char *)(pbVar1 + 1));
            if (iVar4 == 0) {
              pcVar2 = (this->super_cmCommand).Makefile;
              std::__cxx11::string::string((string *)&local_48,__s1,&local_49);
              cmMakefile::RaiseScope(pcVar2,&local_48,(char *)0x0);
              goto LAB_0028f2de;
            }
          }
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"called with an invalid second argument","");
          cmCommand::SetError(&this->super_cmCommand,&local_48);
          goto LAB_0028f279;
        }
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&local_48,__s1,&local_49);
        cmMakefile::RemoveDefinition(pcVar2,&local_48);
      }
LAB_0028f2de:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool cmUnsetCommand::InitialPass(std::vector<std::string> const& args,
                                 cmExecutionStatus &)
{
  if(args.size() < 1 || args.size() > 2)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  const char* variable = args[0].c_str();

  // unset(ENV{VAR})
  if (cmHasLiteralPrefix(variable, "ENV{") && strlen(variable) > 5)
    {
    // what is the variable name
    char *envVarName = new char [strlen(variable)];
    strncpy(envVarName,variable+4,strlen(variable)-5);
    envVarName[strlen(variable)-5] = '\0';

#ifdef CMAKE_BUILD_WITH_CMAKE
    cmSystemTools::UnsetEnv(envVarName);
#endif
    delete[] envVarName;
    return true;
    }
  // unset(VAR)
  else if (args.size() == 1)
    {
    this->Makefile->RemoveDefinition(variable);
    return true;
    }
  // unset(VAR CACHE)
  else if ((args.size() == 2) && (args[1] == "CACHE"))
    {
    this->Makefile->RemoveCacheDefinition(variable);
    return true;
    }
  // unset(VAR PARENT_SCOPE)
  else if ((args.size() == 2) && (args[1] == "PARENT_SCOPE"))
    {
    this->Makefile->RaiseScope(variable, 0);
    return true;
    }
  // ERROR: second argument isn't CACHE or PARENT_SCOPE
  else
    {
    this->SetError("called with an invalid second argument");
    return false;
    }
}